

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_pack_bs_workers
               (AV1_COMP *cpi,PackBSParams *pack_bs_params,AVxWorkerHook hook,int num_workers)

{
  ushort uVar1;
  long lVar2;
  long *plVar3;
  void *__s;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  uint16_t tile_idx;
  PackBSTileOrder *pack_bs_tile_order;
  uint16_t num_tiles;
  AV1EncPackBSSync *pack_bs_sync;
  AV1_COMMON *cm;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  ushort local_62;
  int local_2c;
  
  for (local_2c = in_ECX + -1; -1 < local_2c; local_2c = local_2c + -1) {
    lVar2 = *(long *)(in_RDI + 0x9ae80) + (long)local_2c * 0x38;
    plVar3 = (long *)(*(long *)(in_RDI + 0x9ae88) + (long)local_2c * 0x1d0);
    if (local_2c == 0) {
      plVar3[1] = in_RDI + 0x15030;
    }
    else {
      plVar3[1] = plVar3[2];
    }
    if (plVar3[1] != in_RDI + 0x15030) {
      memcpy((void *)plVar3[1],(void *)(in_RDI + 0x15030),0x256b0);
    }
    *plVar3 = in_RDI;
    *(int *)(plVar3 + 0x39) = local_2c;
    *(int *)((long)plVar3 + 0x1cc) = local_2c;
    av1_reset_pack_bs_thread_data((ThreadData_conflict *)0x260566);
    *(undefined8 *)(lVar2 + 0x18) = in_RDX;
    *(long **)(lVar2 + 0x20) = plVar3;
    *(undefined8 *)(lVar2 + 0x28) = in_RSI;
  }
  uVar1 = (short)*(undefined4 *)(in_RDI + 0x42024) * (short)*(undefined4 *)(in_RDI + 0x42020);
  *(undefined4 *)(in_RDI + 0x9d120) = 0;
  *(undefined1 *)(in_RDI + 0x9d124) = 0;
  __s = (void *)(in_RDI + 0x9b120);
  memset(__s,0,(ulong)uVar1 << 4);
  for (local_62 = 0; local_62 < uVar1; local_62 = local_62 + 1) {
    *(undefined8 *)((long)__s + (ulong)local_62 * 0x10) =
         *(undefined8 *)(*(long *)(in_RDI + 0x71318) + (ulong)local_62 * 0x5d10 + 0x5328);
    *(ushort *)((long)__s + (ulong)local_62 * 0x10 + 8) = local_62;
  }
  qsort(__s,(ulong)uVar1,0x10,compare_tile_order);
  return;
}

Assistant:

static void prepare_pack_bs_workers(AV1_COMP *const cpi,
                                    PackBSParams *const pack_bs_params,
                                    AVxWorkerHook hook, const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    if (thread_data->td != &cpi->td) thread_data->td->mb = cpi->td.mb;

    thread_data->cpi = cpi;
    thread_data->start = i;
    thread_data->thread_id = i;
    av1_reset_pack_bs_thread_data(thread_data->td);

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = pack_bs_params;
  }

  AV1_COMMON *const cm = &cpi->common;
  AV1EncPackBSSync *const pack_bs_sync = &mt_info->pack_bs_sync;
  const uint16_t num_tiles = cm->tiles.rows * cm->tiles.cols;
  pack_bs_sync->next_job_idx = 0;
  pack_bs_sync->pack_bs_mt_exit = false;

  PackBSTileOrder *const pack_bs_tile_order = pack_bs_sync->pack_bs_tile_order;
  // Reset tile order data of pack bitstream
  av1_zero_array(pack_bs_tile_order, num_tiles);

  // Populate pack bitstream tile order structure
  for (uint16_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
    pack_bs_tile_order[tile_idx].abs_sum_level =
        cpi->tile_data[tile_idx].abs_sum_level;
    pack_bs_tile_order[tile_idx].tile_idx = tile_idx;
  }

  // Sort tiles in descending order based on tile area.
  qsort(pack_bs_tile_order, num_tiles, sizeof(*pack_bs_tile_order),
        compare_tile_order);
}